

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixFixSize.h
# Opt level: O0

string * __thiscall iDynTree::MatrixFixSize<6u,6u>::toString_abi_cxx11_(MatrixFixSize<6U,_6U> *this)

{
  size_t sVar1;
  ostream *poVar2;
  MatrixFixSize<6U,_6U> *in_RSI;
  string *in_RDI;
  size_t col;
  size_t row;
  stringstream ss;
  ulong local_1a8;
  ulong local_1a0;
  stringstream local_198 [16];
  undefined1 local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = 0;
  while( true ) {
    sVar1 = MatrixFixSize<6U,_6U>::rows(in_RSI);
    if (sVar1 <= local_1a0) break;
    local_1a8 = 0;
    while( true ) {
      sVar1 = MatrixFixSize<6U,_6U>::cols(in_RSI);
      if (sVar1 <= local_1a8) break;
      sVar1 = MatrixFixSize<6U,_6U>::rawIndexRowMajor(in_RSI,local_1a0,local_1a8);
      poVar2 = (ostream *)std::ostream::operator<<(local_188,in_RSI->m_data[sVar1]);
      std::operator<<(poVar2," ");
      local_1a8 = local_1a8 + 1;
    }
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string MatrixFixSize<nRows,nCols>::toString() const
    {
        std::stringstream ss;

        for(std::size_t row=0; row < this->rows(); row++ )
        {
            for(std::size_t col=0; col < this->cols(); col++ )
            {
                ss << this->m_data[this->rawIndexRowMajor(row,col)] << " ";
            }
            ss << std::endl;
        }

        return ss.str();
    }